

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstCountPass.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1d1e::InstCountPass::runOnFunction(InstCountPass *this,Function *F)

{
  raw_ostream *prVar1;
  Function *pFVar2;
  Function *pFVar3;
  Function *pFVar4;
  int N;
  StringRef Str;
  
  prVar1 = (raw_ostream *)llvm::errs();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,"Function ");
  Str = (StringRef)llvm::Value::getName();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,Str);
  llvm::raw_ostream::operator<<(prVar1," contains ");
  N = 0;
  for (pFVar2 = F + 0x50; pFVar2 = *(Function **)pFVar2, pFVar2 != F + 0x48; pFVar2 = pFVar2 + 8) {
    pFVar3 = pFVar2 + -0x18;
    if (pFVar2 == (Function *)0x0) {
      pFVar3 = (Function *)0x0;
    }
    for (pFVar4 = pFVar3 + 0x30; *(Function **)pFVar4 != pFVar3 + 0x28;
        pFVar4 = *(Function **)pFVar4 + 8) {
      N = N + 1;
    }
  }
  prVar1 = (raw_ostream *)llvm::errs();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,N);
  llvm::raw_ostream::operator<<(prVar1," LLVM instructions\n");
  return false;
}

Assistant:

bool InstCountPass::runOnFunction(Function &F) {
    errs() << "Function " << F.getName() << " contains ";
    int instcount = 0;
    for (auto& bb : F) {
      for (auto& i : bb) {
        instcount++;
      }
    }
    errs() << instcount << " LLVM instructions\n";
    return false; 
}